

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-emfile.c
# Opt level: O0

int run_test_emfile(void)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *puVar3;
  bool bVar4;
  int local_9c;
  int first_fd;
  uv_loop_t *loop;
  uv_connect_t connect_req;
  rlimit limits;
  sockaddr_in addr;
  
  limits.rlim_cur = 0x20;
  connect_req.queue[1] = (void *)0x20;
  iVar1 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)(connect_req.queue + 1));
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)((long)&limits.rlim_max + 4));
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x3e,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)");
      abort();
    }
    iVar1 = uv_tcp_init(puVar3,&server_handle);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x3f,"0 == uv_tcp_init(loop, &server_handle)");
      abort();
    }
    iVar1 = uv_tcp_init(puVar3,&client_handle);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x40,"0 == uv_tcp_init(loop, &client_handle)");
      abort();
    }
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)((long)&limits.rlim_max + 4),0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x41,"0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)");
      abort();
    }
    iVar1 = uv_listen((uv_stream_t *)&server_handle,8,connection_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x42,"0 == uv_listen((uv_stream_t*) &server_handle, 8, connection_cb)");
      abort();
    }
    do {
      local_9c = dup(0);
      bVar4 = false;
      if (local_9c == -1) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    if (local_9c < 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x48,"first_fd > 0");
      abort();
    }
    do {
      iVar1 = dup(0);
      bVar4 = true;
      if (iVar1 == -1) {
        piVar2 = __errno_location();
        bVar4 = *piVar2 == 4;
      }
    } while (bVar4);
    piVar2 = __errno_location();
    if (*piVar2 != 0x18) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x4b,"errno == EMFILE");
      abort();
    }
    close(0x1f);
    iVar1 = uv_tcp_connect((uv_connect_t *)&loop,&client_handle,
                           (sockaddr *)((long)&limits.rlim_max + 4),connect_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x55,
              "0 == uv_tcp_connect(&connect_req, &client_handle, (const struct sockaddr*) &addr, connect_cb)"
             );
      abort();
    }
    iVar1 = uv_run(puVar3,UV_RUN_DEFAULT);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x56,"0 == uv_run(loop, UV_RUN_DEFAULT)");
      abort();
    }
    if (connect_cb_called != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x57,"1 == connect_cb_called");
      abort();
    }
    for (; local_9c < 0x1f; local_9c = local_9c + 1) {
      close(local_9c);
    }
    puVar3 = uv_default_loop();
    close_loop(puVar3);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x61,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 != 1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
              ,0x39,"errno == EPERM");
      abort();
    }
    fprintf(_stderr,"%s\n","setrlimit(RLIMIT_NOFILE) failed, running under valgrind?");
    fflush(_stderr);
    addr.sin_zero[0] = '\x01';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

TEST_IMPL(emfile) {
  struct sockaddr_in addr;
  struct rlimit limits;
  uv_connect_t connect_req;
  uv_loop_t* loop;
  int first_fd;
#if defined(_AIX) || defined(__MVS__)
  /* On AIX, if a 'accept' call fails ECONNRESET is set on the socket
   * which causes uv__emfile_trick to not work as intended and this test
   * to fail.
   */
  RETURN_SKIP("uv__emfile_trick does not work on this OS");
#endif

  /* Lower the file descriptor limit and use up all fds save one. */
  limits.rlim_cur = limits.rlim_max = maxfd + 1;
  if (setrlimit(RLIMIT_NOFILE, &limits)) {
    ASSERT(errno == EPERM);  /* Valgrind blocks the setrlimit() call. */
    RETURN_SKIP("setrlimit(RLIMIT_NOFILE) failed, running under valgrind?");
  }

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 8, connection_cb));

  /* Remember the first one so we can clean up afterwards. */
  do
    first_fd = dup(0);
  while (first_fd == -1 && errno == EINTR);
  ASSERT(first_fd > 0);

  while (dup(0) != -1 || errno == EINTR);
  ASSERT(errno == EMFILE);
  close(maxfd);

  /* Now connect and use up the last available file descriptor.  The EMFILE
   * handling logic in src/unix/stream.c should ensure that connect_cb() runs
   * whereas connection_cb() should *not* run.
   */
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == connect_cb_called);

  /* Close the dups again. Ignore errors in the unlikely event that the
   * file descriptors were not contiguous.
   */
  while (first_fd < maxfd) {
    close(first_fd);
    first_fd += 1;
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}